

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  int32_t length;
  rle16_t *prVar2;
  ushort *puVar3;
  rle16_t *prVar4;
  ushort uVar5;
  _Bool _Var6;
  uint uVar7;
  int32_t pos;
  run_container_t *prVar8;
  array_container_t *paVar9;
  bitset_container_t *src_1_00;
  run_container_t *prVar10;
  uint16_t *puVar11;
  uint uVar12;
  int32_t i;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ushort *puVar17;
  uint16_t uVar18;
  int iVar19;
  int iVar20;
  uint8_t return_type;
  run_container_t *local_58;
  container_t **local_50;
  array_container_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_58 = src_1;
  uVar7 = run_container_cardinality(src_1);
  local_50 = dst;
  local_48 = src_2;
  if ((int)uVar7 < 0x21) {
    if (src_2->cardinality != 0) {
      prVar8 = run_container_create_given_capacity(src_2->cardinality + uVar7);
      prVar2 = local_58->runs;
      uVar7 = (uint)prVar2->value;
      uVar15 = (uint)prVar2->value + (uint)prVar2->length + 1;
      puVar3 = src_2->array;
      iVar20 = local_58->n_runs;
      iVar13 = 0;
      uVar12 = 0;
      puVar17 = puVar3;
LAB_0010ade8:
      uVar1 = *puVar17;
      uVar16 = uVar7;
LAB_0010adf0:
      do {
        uVar7 = uVar16;
        uVar5 = (ushort)uVar7;
        uVar18 = (short)uVar15 + ~uVar5;
LAB_0010adfd:
        do {
          if (iVar20 <= (int)uVar12) {
LAB_0010b03b:
            prVar10 = (run_container_t *)convert_run_to_efficient_container(prVar8,&return_type);
            *local_50 = prVar10;
            if (prVar8 != prVar10) {
              run_container_free(prVar8);
            }
            return (uint)return_type;
          }
          if (src_2->cardinality <= iVar13) {
            prVar4 = prVar8->runs;
            lVar14 = (long)prVar8->n_runs;
            iVar19 = (int)(lVar14 + 1);
            prVar8->n_runs = iVar19;
            prVar4[lVar14].value = uVar5;
            prVar4[lVar14].length = uVar18;
            iVar13 = uVar12 + 1;
            if (iVar20 - iVar13 != 0 && iVar13 <= iVar20) {
              memcpy(prVar4 + lVar14 + 1,prVar2 + iVar13,(long)(iVar20 - iVar13) << 2);
              prVar8->n_runs = ~uVar12 + local_58->n_runs + iVar19;
            }
            goto LAB_0010b03b;
          }
          uVar16 = (uint)uVar1;
          if (uVar16 < uVar15) {
            if (uVar16 < uVar7) {
              iVar13 = iVar13 + 1;
              if (iVar13 < src_2->cardinality) {
                puVar17 = puVar3 + iVar13;
                goto LAB_0010ade8;
              }
              goto LAB_0010adfd;
            }
            if (uVar7 < uVar16) {
              prVar4 = prVar8->runs;
              iVar19 = prVar8->n_runs;
              prVar8->n_runs = iVar19 + 1;
              prVar4[iVar19].value = uVar5;
              prVar4[iVar19].length = ~uVar5 + uVar1;
              src_2 = local_48;
            }
            uVar16 = uVar1 + 1;
            if (uVar1 + 1 < uVar15) goto LAB_0010adf0;
          }
          else {
            prVar4 = prVar8->runs;
            iVar19 = prVar8->n_runs;
            prVar8->n_runs = iVar19 + 1;
            prVar4[iVar19].value = uVar5;
            prVar4[iVar19].length = uVar18;
            src_2 = local_48;
          }
          uVar12 = uVar12 + 1;
        } while (iVar20 <= (int)uVar12);
        uVar15 = (uint)prVar2[(int)uVar12].length + (uint)prVar2[(int)uVar12].value + 1;
        uVar16 = (uint)prVar2[(int)uVar12].value;
      } while( true );
    }
    prVar8 = run_container_clone(local_58);
    *dst = prVar8;
    iVar20 = 3;
  }
  else if (uVar7 < 0x1001) {
    paVar9 = array_container_create_given_capacity(uVar7);
    local_40 = 0;
    local_38 = (ulong)(uint)local_58->n_runs;
    if (local_58->n_runs < 1) {
      local_38 = local_40;
    }
    pos = -1;
    iVar20 = 0;
    for (; local_40 != local_38; local_40 = local_40 + 1) {
      uVar1 = local_58->runs[local_40].value;
      uVar7 = (uint)uVar1;
      uVar12 = (uint)local_58->runs[local_40].length + (uint)uVar1;
      puVar11 = local_48->array;
      length = local_48->cardinality;
      pos = advanceUntil(puVar11,pos,length,uVar1);
      if (pos < length) {
        uVar15 = (uint)puVar11[pos];
        if (uVar12 < puVar11[pos]) {
          puVar11 = paVar9->array + iVar20;
          for (; uVar7 <= uVar12; uVar7 = uVar7 + 1) {
            *puVar11 = (uint16_t)uVar7;
            iVar20 = iVar20 + 1;
            puVar11 = puVar11 + 1;
          }
        }
        else {
          for (; uVar7 <= uVar12; uVar7 = uVar7 + 1) {
            if (uVar7 == uVar15) {
              iVar13 = pos + 1;
              if (iVar13 < length) {
                uVar15 = (uint)puVar11[iVar13];
                pos = iVar13;
              }
              else {
                uVar15 = 0;
              }
            }
            else {
              lVar14 = (long)iVar20;
              iVar20 = iVar20 + 1;
              paVar9->array[lVar14] = (uint16_t)uVar7;
            }
          }
        }
        pos = pos + -1;
      }
      else {
        puVar11 = paVar9->array + iVar20;
        for (; uVar7 <= uVar12; uVar7 = uVar7 + 1) {
          *puVar11 = (uint16_t)uVar7;
          iVar20 = iVar20 + 1;
          puVar11 = puVar11 + 1;
        }
      }
    }
    paVar9->cardinality = iVar20;
    *local_50 = paVar9;
    iVar20 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(local_58);
    _Var6 = bitset_array_container_iandnot(src_1_00,src_2,dst);
    iVar20 = 2 - (uint)_Var6;
  }
  return iVar20;
}

Assistant:

int run_array_container_andnot(
    const run_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] = MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE
                             : ARRAY_CONTAINER_TYPE);
}